

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.cpp
# Opt level: O2

void __thiscall FIX::Dictionary::setBool(Dictionary *this,string *key,bool value)

{
  mapped_type *this_00;
  undefined3 in_register_00000011;
  string local_70;
  string local_50;
  string local_30;
  
  BoolConvertor::convert_abi_cxx11_
            (&local_30,(BoolConvertor *)(ulong)CONCAT31(in_register_00000011,value),value);
  string_toUpper(&local_70,key);
  string_strip(&local_50,&local_70);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this->m_data,&local_50);
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void Dictionary::setBool(const std::string &key, bool value) {
  m_data[string_strip(string_toUpper(key))] = BoolConvertor::convert(value);
}